

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
          (SmallVectorBase<slang::parsing::Token> *this,Token *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  Info *pIVar5;
  undefined8 uVar6;
  pointer pTVar7;
  pointer pTVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  pointer pTVar12;
  long lVar13;
  long lVar14;
  pointer __src;
  ulong uVar15;
  long lVar16;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    uVar9 = args->field_0x2;
    NVar10.raw = (args->numFlags).raw;
    uVar11 = args->rawLen;
    pIVar5 = args->info;
    __src->kind = args->kind;
    __src->field_0x2 = uVar9;
    __src->numFlags = (NumericTokenFlags)NVar10.raw;
    __src->rawLen = uVar11;
    __src->info = pIVar5;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar15 = this->len + 1;
  uVar4 = this->cap;
  if (uVar15 < uVar4 * 2) {
    uVar15 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar15 = 0x7ffffffffffffff;
  }
  lVar16 = (long)__src - (long)this->data_;
  pTVar12 = (pointer)operator_new(uVar15 << 4);
  pIVar5 = args->info;
  *(undefined8 *)((long)pTVar12 + lVar16) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar12 + lVar16))[1] = pIVar5;
  p = this->data_;
  lVar13 = this->len * 0x10;
  lVar14 = (long)p + (lVar13 - (long)__src);
  pTVar7 = p;
  pTVar8 = pTVar12;
  if (lVar14 == 0) {
    if (this->len != 0) {
      lVar14 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->kind + lVar14);
        uVar6 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pTVar12->kind + lVar14);
        *puVar2 = *puVar1;
        puVar2[1] = uVar6;
        lVar14 = lVar14 + 0x10;
      } while (lVar13 != lVar14);
    }
  }
  else {
    for (; pTVar7 != __src; pTVar7 = pTVar7 + 1) {
      uVar9 = pTVar7->field_0x2;
      NVar10.raw = (pTVar7->numFlags).raw;
      uVar11 = pTVar7->rawLen;
      pIVar5 = pTVar7->info;
      pTVar8->kind = pTVar7->kind;
      pTVar8->field_0x2 = uVar9;
      pTVar8->numFlags = (NumericTokenFlags)NVar10.raw;
      pTVar8->rawLen = uVar11;
      pTVar8->info = pIVar5;
      pTVar8 = pTVar8 + 1;
    }
    memcpy((void *)((long)pTVar12 + lVar16 + 0x10),__src,
           (lVar14 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar15;
  this->data_ = pTVar12;
  return (reference)((long)pTVar12 + lVar16);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }